

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderingUtils.hpp
# Opt level: O0

void __thiscall
Kernel::MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~MultiSet
          (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this)

{
  Lib::
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::IntegerConstantType>_>
  ::~Stack(&this->_elems);
  return;
}

Assistant:

void integrity() const {
#if VDEBUG
      ASS(std::is_sorted(_elems.begin(), _elems.end(), [](auto l, auto r) { return std::get<0>(l) < std::get<0>(r); }))
      for (auto e : _elems) {
        ASS_G(std::get<1>(e), IntegerConstantType(0))
      }
#endif
    }